

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O0

time_units gmlc::utilities::timeUnitsFromString(string_view unitString)

{
  string_view trimCharacters;
  string_view input;
  bool bVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RSI;
  undefined8 in_RDI;
  string lcUstring;
  const_iterator fnd;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_time_units,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
  *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  char *__rhs;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  char in_stack_fffffffffffffecf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  string local_c8 [32];
  _Self local_a8 [3];
  __sv_type local_90;
  _Base_ptr local_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string_view local_58;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  time_units local_4;
  
  local_18 = in_RDI;
  uStack_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_time_units,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
       ::find(in_stack_fffffffffffffe98,(key_type *)0x6a728b);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_time_units,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
       ::end(in_stack_fffffffffffffe98);
  bVar1 = std::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_68 = local_18;
    uStack_60 = uStack_10;
    local_78 = 4;
    pcStack_70 = " \t\n\r";
    input._M_str = (char *)in_stack_fffffffffffffee0;
    input._M_len = (size_t)in_stack_fffffffffffffed8;
    trimCharacters._M_len._6_1_ = in_stack_fffffffffffffece;
    trimCharacters._M_len._0_6_ = in_stack_fffffffffffffec8;
    trimCharacters._M_len._7_1_ = in_stack_fffffffffffffecf;
    trimCharacters._M_str = (char *)in_stack_fffffffffffffed0;
    local_58 = string_viewOps::trim(input,trimCharacters);
    convertToLowerCase_abi_cxx11_(in_stack_fffffffffffffef0);
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffea0);
    local_80 = (_Base_ptr)
               std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_time_units,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
               ::find(in_stack_fffffffffffffe98,(key_type *)0x6a7384);
    local_20._M_node = local_80;
    local_a8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_time_units,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
         ::end(in_stack_fffffffffffffe98);
    bVar1 = std::operator==(&local_20,local_a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                 (allocator<char> *)in_stack_fffffffffffffed0);
      __rhs = &stack0xfffffffffffffecf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffee0,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (allocator<char> *)in_stack_fffffffffffffed0);
      std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::operator+(__lhs,__rhs);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_c8);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>
                           *)0x6a73e6);
    local_4 = ppVar2->second;
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>
                           *)0x6a72d1);
    local_4 = ppVar2->second;
  }
  return local_4;
}

Assistant:

time_units timeUnitsFromString(std::string_view unitString)
{
    auto fnd = time_unitstrings.find(unitString);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    std::string lcUstring =
        convertToLowerCase(string_viewOps::trim(unitString));
    fnd = time_unitstrings.find(lcUstring);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    throw(std::invalid_argument(
        std::string("unit ") + std::string(unitString) + " not recognized"));
}